

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::updateSimplicity
          (Geometry<std::allocator<unsigned_long>_> *this)

{
  size_t sVar1;
  bool bVar2;
  size_t *psVar3;
  size_t j;
  ulong j_00;
  
  j_00 = 0;
  do {
    if (this->dimension_ <= j_00) {
      bVar2 = true;
      goto LAB_00107b62;
    }
    psVar3 = shapeStrides(this,j_00);
    sVar1 = *psVar3;
    psVar3 = strides(this,j_00);
    j_00 = j_00 + 1;
  } while (sVar1 == *psVar3);
  bVar2 = false;
LAB_00107b62:
  this->isSimple_ = bVar2;
  return;
}

Assistant:

inline void
Geometry<A>::updateSimplicity()
{ 
    for(std::size_t j=0; j<dimension(); ++j) {
        if(shapeStrides(j) != strides(j)) {
            isSimple_ = false;
            return;
        }
    }
    isSimple_ = true; 
    // a 0-dimensional geometry is simple
}